

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::YoloDetectionOutput::~YoloDetectionOutput(YoloDetectionOutput *this)

{
  undefined8 *in_RDI;
  Layer *this_00;
  
  *in_RDI = &PTR__YoloDetectionOutput_00177ad0;
  this_00 = (Layer *)in_RDI[0x19];
  if (this_00 != (Layer *)0x0) {
    (*this_00->_vptr_Layer[1])();
  }
  Mat::~Mat((Mat *)0x156b8d);
  Layer::~Layer(this_00);
  return;
}

Assistant:

YoloDetectionOutput::~YoloDetectionOutput()
{
    delete softmax;
}